

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

uint setup_center_error(MACROBLOCKD *xd,MV *bestmv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
                       MV_COST_PARAMS *mv_cost_params,uint *sse1,int *distortion)

{
  MV_COST_TYPE MVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int width;
  int height;
  int iVar5;
  int iVar6;
  aom_variance_fn_ptr_t *paVar7;
  buf_2d *pbVar8;
  buf_2d *pbVar9;
  uint8_t *puVar10;
  uint8_t *pred8;
  uint8_t *puVar11;
  uint uVar12;
  int iVar13;
  short sVar14;
  short sVar15;
  uint8_t *comp_pred8;
  short sVar16;
  short sVar17;
  uint8_t *ref8;
  uint8_t comp_pred [16384];
  
  paVar7 = var_params->vfp;
  pbVar8 = (var_params->ms_buffers).ref;
  pbVar9 = (var_params->ms_buffers).src;
  iVar13 = pbVar8->stride;
  ref8 = pbVar8->buf + (((int)*bestmv >> 0x13) + ((int)(*bestmv).row >> 3) * iVar13);
  puVar10 = pbVar9->buf;
  iVar4 = pbVar9->stride;
  pred8 = (var_params->ms_buffers).second_pred;
  if (pred8 == (uint8_t *)0x0) {
    uVar12 = (*paVar7->vf)(ref8,iVar13,puVar10,iVar4,sse1);
  }
  else {
    width = var_params->w;
    height = var_params->h;
    puVar11 = (var_params->ms_buffers).mask;
    iVar5 = (var_params->ms_buffers).mask_stride;
    iVar6 = (var_params->ms_buffers).inv_mask;
    if ((xd->cur_buf->flags & 8) == 0) {
      if (puVar11 == (uint8_t *)0x0) {
        (*aom_comp_avg_pred)(comp_pred,pred8,width,height,ref8,iVar13);
      }
      else {
        (*aom_comp_mask_pred)(comp_pred,pred8,width,height,ref8,iVar13,puVar11,iVar5,iVar6);
      }
      uVar12 = (*paVar7->vf)(comp_pred,width,puVar10,iVar4,sse1);
    }
    else {
      comp_pred8 = (uint8_t *)((ulong)comp_pred >> 1);
      if (puVar11 == (uint8_t *)0x0) {
        aom_highbd_comp_avg_pred_c(comp_pred8,pred8,width,height,ref8,iVar13);
      }
      else {
        (*aom_highbd_comp_mask_pred)(comp_pred8,pred8,width,height,ref8,iVar13,puVar11,iVar5,iVar6);
      }
      uVar12 = (*paVar7->vf)(comp_pred8,width,puVar10,iVar4,sse1);
    }
  }
  *distortion = uVar12;
  MVar1 = mv_cost_params->mv_cost_type;
  iVar13 = 0;
  if (MVar1 != '\x04') {
    sVar2 = mv_cost_params->ref_mv->row;
    sVar14 = bestmv->row - sVar2;
    sVar3 = mv_cost_params->ref_mv->col;
    sVar16 = bestmv->col - sVar3;
    sVar15 = -sVar14;
    if (0 < sVar14) {
      sVar15 = sVar14;
    }
    sVar17 = -sVar16;
    if (0 < sVar16) {
      sVar17 = sVar16;
    }
    if (MVar1 == '\x03') {
      iVar13 = (int)sVar17 + (int)sVar15 >> 3;
    }
    else if (MVar1 == '\x01') {
      iVar13 = (int)sVar17 + (int)sVar15 >> 2;
    }
    else if (MVar1 == '\0') {
      iVar13 = (int)(((long)mv_cost_params->mvcost[1][sVar16] +
                      (long)mv_cost_params->mvcost[0][sVar14] +
                     (long)*(int *)((long)mv_cost_params->mvjcost +
                                   (ulong)((uint)(bestmv->col != sVar3) * 4 +
                                          (uint)(bestmv->row != sVar2) * 8))) *
                     (long)mv_cost_params->error_per_bit + 0x2000U >> 0xe);
    }
  }
  return iVar13 + uVar12;
}

Assistant:

static unsigned int setup_center_error(
    const MACROBLOCKD *xd, const MV *bestmv,
    const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *sse1, int *distortion) {
  const aom_variance_fn_ptr_t *vfp = var_params->vfp;
  const int w = var_params->w;
  const int h = var_params->h;

  const MSBuffers *ms_buffers = &var_params->ms_buffers;
  const uint8_t *src = ms_buffers->src->buf;
  const uint8_t *y = get_buf_from_mv(ms_buffers->ref, *bestmv);
  const int src_stride = ms_buffers->src->stride;
  const int y_stride = ms_buffers->ref->stride;
  const uint8_t *second_pred = ms_buffers->second_pred;
  const uint8_t *mask = ms_buffers->mask;
  const int mask_stride = ms_buffers->mask_stride;
  const int invert_mask = ms_buffers->inv_mask;

  unsigned int besterr;

  if (second_pred != NULL) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_cur_buf_hbd(xd)) {
      DECLARE_ALIGNED(16, uint16_t, comp_pred16[MAX_SB_SQUARE]);
      uint8_t *comp_pred = CONVERT_TO_BYTEPTR(comp_pred16);
      if (mask) {
        aom_highbd_comp_mask_pred(comp_pred, second_pred, w, h, y, y_stride,
                                  mask, mask_stride, invert_mask);
      } else {
        aom_highbd_comp_avg_pred(comp_pred, second_pred, w, h, y, y_stride);
      }
      besterr = vfp->vf(comp_pred, w, src, src_stride, sse1);
    } else {
      DECLARE_ALIGNED(16, uint8_t, comp_pred[MAX_SB_SQUARE]);
      if (mask) {
        aom_comp_mask_pred(comp_pred, second_pred, w, h, y, y_stride, mask,
                           mask_stride, invert_mask);
      } else {
        aom_comp_avg_pred(comp_pred, second_pred, w, h, y, y_stride);
      }
      besterr = vfp->vf(comp_pred, w, src, src_stride, sse1);
    }
#else
    (void)xd;
    DECLARE_ALIGNED(16, uint8_t, comp_pred[MAX_SB_SQUARE]);
    if (mask) {
      aom_comp_mask_pred(comp_pred, second_pred, w, h, y, y_stride, mask,
                         mask_stride, invert_mask);
    } else {
      aom_comp_avg_pred(comp_pred, second_pred, w, h, y, y_stride);
    }
    besterr = vfp->vf(comp_pred, w, src, src_stride, sse1);
#endif
  } else {
    besterr = vfp->vf(y, y_stride, src, src_stride, sse1);
  }
  *distortion = besterr;
  besterr += mv_err_cost_(bestmv, mv_cost_params);
  return besterr;
}